

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_copy_attribute
               (xml_attribute_struct *da,xml_attribute_struct *sa)

{
  xml_allocator *pxVar1;
  xml_allocator *alloc;
  
  if ((da != (xml_attribute_struct *)0x0) && (sa != (xml_attribute_struct *)0x0)) {
    pxVar1 = *(xml_allocator **)((long)da - (da->header >> 8));
    alloc = (xml_allocator *)0x0;
    if (pxVar1 == *(xml_allocator **)((long)sa - (sa->header >> 8))) {
      alloc = pxVar1;
    }
    (anonymous_namespace)::node_copy_string<char*,unsigned_long>
              (&da->name,&da->header,0x20,sa->name,&sa->header,alloc);
    (anonymous_namespace)::node_copy_string<char*,unsigned_long>
              (&da->value,&da->header,0x10,sa->value,&sa->header,alloc);
    return;
  }
  __assert_fail("object",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                ,0x489,
                "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_attribute_struct]"
               );
}

Assistant:

inline xml_allocator& get_allocator(const Object* object)
	{
		assert(object);

		return *PUGI__GETPAGE(object)->allocator;
	}